

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type)

{
  size_t sVar1;
  CompilerError *pCVar2;
  uint local_58;
  allocator local_51;
  uint32_t i;
  SPIRType *local_20;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *e;
  
  local_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if ((((this->backend).use_array_constructor & 1U) != 0) &&
     (sVar1 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>),
     1 < sVar1)) {
    if (((this->options).flatten_multidimensional_arrays & 1U) != 0) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar2,
                 "Cannot flatten constructors of multidimensional array constructors, e.g. float[][]()."
                );
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1ae)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&i,"GL_ARB_arrays_of_arrays",&local_51);
      require_extension_internal(this,(string *)&i);
      ::std::__cxx11::string::~string((string *)&i);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    else if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"Arrays of arrays not supported before ESSL version 310.")
      ;
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
  }
  (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,local_20,0);
  if (((this->backend).use_array_constructor & 1U) != 0) {
    for (local_58 = 0;
        sVar1 = VectorView<unsigned_int>::size(&(local_20->array).super_VectorView<unsigned_int>),
        local_58 < sVar1; local_58 = local_58 + 1) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[]");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl_constructor(const SPIRType &type)
{
	if (backend.use_array_constructor && type.array.size() > 1)
	{
		if (options.flatten_multidimensional_arrays)
			SPIRV_CROSS_THROW("Cannot flatten constructors of multidimensional array constructors, "
			                  "e.g. float[][]().");
		else if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_arrays_of_arrays");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310.");
	}

	auto e = type_to_glsl(type);
	if (backend.use_array_constructor)
	{
		for (uint32_t i = 0; i < type.array.size(); i++)
			e += "[]";
	}
	return e;
}